

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O0

void ITStatus_setITState(ARM_ITStatus *it,char Firstcond,char Mask)

{
  byte v;
  char in_DL;
  byte in_SIL;
  ARM_ITStatus *in_RDI;
  _Bool T;
  uint Pos;
  uchar CCBits;
  uint NumTZ;
  uint CondBit0;
  undefined4 local_1c;
  
  local_1c = CountTrailingZeros_32((int)in_DL);
  v = in_SIL & 0xf;
  while (local_1c = local_1c + 1, local_1c < 4) {
    if (((int)in_DL >> ((byte)local_1c & 0x1f) & 1U) == ((int)(char)in_SIL & 1U)) {
      ITStatus_push_back(in_RDI,v);
    }
    else {
      ITStatus_push_back(in_RDI,v ^ 1);
    }
  }
  ITStatus_push_back(in_RDI,v);
  return;
}

Assistant:

static void ITStatus_setITState(ARM_ITStatus *it, char Firstcond, char Mask)
{
	// (3 - the number of trailing zeros) is the number of then / else.
	unsigned CondBit0 = Firstcond & 1;
	unsigned NumTZ = CountTrailingZeros_32(Mask);
	unsigned char CCBits = (unsigned char)Firstcond & 0xf;
	unsigned Pos;
	//assert(NumTZ <= 3 && "Invalid IT mask!");
	// push condition codes onto the stack the correct order for the pops
	for (Pos = NumTZ+1; Pos <= 3; ++Pos) {
		bool T = ((Mask >> Pos) & 1) == (int)CondBit0;
		if (T)
			ITStatus_push_back(it, CCBits);
		else
			ITStatus_push_back(it, CCBits ^ 1);
	}
	ITStatus_push_back(it, CCBits);
}